

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O3

void cJSON_Minify(char *json)

{
  byte bVar1;
  byte *pbVar2;
  ulong uVar3;
  char *into;
  byte *pbVar4;
  
  pbVar2 = (byte *)json;
  if (json != (char *)0x0) {
LAB_00105611:
    pbVar4 = pbVar2;
    bVar1 = *pbVar4;
    uVar3 = (ulong)bVar1;
    if (uVar3 < 0x30) {
      if ((0x100002600U >> (uVar3 & 0x3f) & 1) == 0) {
        if (uVar3 == 0x22) {
          *json = 0x22;
          bVar1 = pbVar4[1];
          while( true ) {
            pbVar4 = pbVar4 + 1;
            json = (char *)((byte *)json + 1);
            pbVar2 = pbVar4;
            if (bVar1 == 0) break;
            *json = bVar1;
            if (*pbVar4 == 0x5c) {
              if (pbVar4[1] == 0x22) {
                pbVar4 = pbVar4 + 1;
                ((byte *)json)[1] = 0x22;
                json = (char *)((byte *)json + 1);
              }
            }
            else if (*pbVar4 == 0x22) {
              *json = 0x22;
              json = (char *)((byte *)json + 1);
              pbVar2 = pbVar4 + 1;
              break;
            }
            bVar1 = pbVar4[1];
          }
        }
        else {
          if (uVar3 != 0x2f) goto LAB_00105665;
          if (pbVar4[1] == 0x2a) {
            pbVar2 = pbVar4 + 2;
            do {
              if (*pbVar2 == 0x2a) {
                if (pbVar2[1] == 0x2f) {
                  pbVar2 = pbVar2 + 2;
                  goto LAB_00105611;
                }
              }
              else if (*pbVar2 == 0) goto LAB_00105611;
              pbVar2 = pbVar2 + 1;
            } while( true );
          }
          pbVar2 = pbVar4 + 1;
          if (pbVar4[1] == 0x2f) {
            pbVar2 = pbVar4 + 2;
            do {
              bVar1 = *pbVar2;
              if (bVar1 == 0) break;
              pbVar2 = pbVar2 + 1;
            } while (bVar1 != 10);
          }
        }
      }
      else {
        pbVar2 = pbVar4 + 1;
      }
      goto LAB_00105611;
    }
LAB_00105665:
    if (bVar1 != 0) {
      *json = bVar1;
      json = (char *)((byte *)json + 1);
      pbVar2 = pbVar4 + 1;
      goto LAB_00105611;
    }
    *json = 0;
  }
  return;
}

Assistant:

CJSON_PUBLIC(void) cJSON_Minify(char *json)
{
    char *into = json;

    if (json == NULL)
    {
        return;
    }

    while (json[0] != '\0')
    {
        switch (json[0])
        {
            case ' ':
            case '\t':
            case '\r':
            case '\n':
                json++;
                break;

            case '/':
                if (json[1] == '/')
                {
                    skip_oneline_comment(&json);
                }
                else if (json[1] == '*')
                {
                    skip_multiline_comment(&json);
                } else {
                    json++;
                }
                break;

            case '\"':
                minify_string(&json, (char**)&into);
                break;

            default:
                into[0] = json[0];
                json++;
                into++;
        }
    }

    /* and null-terminate. */
    *into = '\0';
}